

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [64];
  pointer pbVar3;
  char *pcVar4;
  pointer pbVar5;
  char cVar6;
  int iVar7;
  int32_t k;
  int iVar8;
  int32_t iVar9;
  int *piVar10;
  long lVar11;
  ostream *poVar12;
  ulong uVar13;
  int iVar14;
  real threshold;
  double dVar15;
  shared_ptr<const_fasttext::Dictionary> dict;
  FastText fasttext;
  ifstream ifs;
  Dictionary *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  FastText local_338;
  undefined1 local_2b8 [88];
  float fStack_260;
  undefined4 uStack_25c;
  undefined1 auStack_258 [16];
  bool local_248;
  string local_238 [16];
  
  iVar7 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1));
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
  if (uVar13 - 7 < 0xfffffffffffffffd) {
    if (iVar7 == 0) {
      printTestLabelUsage();
      goto LAB_00138837;
    }
LAB_00138832:
    printTestUsage();
    goto LAB_00138837;
  }
  k = 1;
  if (4 < uVar13) {
    pcVar4 = pbVar3[4]._M_dataplus._M_p;
    piVar10 = __errno_location();
    iVar8 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar4,(char **)local_238,10);
    if (local_238[0]._M_dataplus._M_p == pcVar4) {
      std::__throw_invalid_argument("stoi");
      goto LAB_00138832;
    }
    iVar14 = *piVar10;
    if ((int)lVar11 != lVar11 || iVar14 == 0x22) {
      lVar11 = std::__throw_out_of_range("stoi");
    }
    k = (int32_t)lVar11;
    if (iVar14 == 0) {
      *piVar10 = iVar8;
    }
  }
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  threshold = 0.0;
  if (0xa0 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
    pcVar4 = pbVar5[5]._M_dataplus._M_p;
    piVar10 = __errno_location();
    iVar8 = *piVar10;
    *piVar10 = 0;
    threshold = strtof(pcVar4,(char **)local_238);
    if (local_238[0]._M_dataplus._M_p == pcVar4) {
      std::__throw_invalid_argument("stof");
    }
    if (*piVar10 != 0) {
      if (*piVar10 != 0x22) goto LAB_001388ec;
      std::__throw_out_of_range("stof");
    }
    *piVar10 = iVar8;
  }
LAB_001388ec:
  ::fasttext::FastText::FastText(&local_338);
  ::fasttext::FastText::loadModel(&local_338,pbVar3 + 2);
  local_2b8._56_8_ = auStack_258 + 8;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  uStack_25c = auVar2._44_4_;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_2b8._0_48_ = auVar2._0_48_;
  local_2b8._48_8_ = auVar2._48_8_;
  local_2b8._64_8_ = 1;
  local_2b8._72_16_ = (undefined1  [16])0x0;
  fStack_260 = 1.0;
  auStack_258 = (undefined1  [16])0x0;
  local_248 = false;
  iVar8 = std::__cxx11::string::compare((char *)(pbVar3 + 3));
  if (iVar8 == 0) {
    ::fasttext::FastText::test(&local_338,(istream *)&std::cin,k,threshold,(Meter *)local_2b8);
  }
  else {
    std::ifstream::ifstream(local_238,(string *)(pbVar3 + 3),_S_in);
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Test file cannot be opened!",0x1b);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00138837:
      exit(1);
    }
    ::fasttext::FastText::test(&local_338,(istream *)local_238,k,threshold,(Meter *)local_2b8);
    std::ifstream::~ifstream(local_238);
  }
  lVar11 = std::cout;
  if (iVar7 == 0) {
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar11 + -0x18)) = 6;
    ::fasttext::FastText::getDictionary(&local_338);
    paVar1 = &local_238[0].field_2;
    iVar7 = 0;
    while( true ) {
      iVar9 = ::fasttext::Dictionary::nlabels(local_348);
      if (iVar9 <= iVar7) break;
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"F1-Score","");
      dVar15 = ::fasttext::Meter::f1Score((Meter *)local_2b8,iVar7);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Precision","");
      dVar15 = ::fasttext::Meter::precision((Meter *)local_2b8,iVar7);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Recall","");
      dVar15 = ::fasttext::Meter::recall((Meter *)local_2b8,iVar7);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      ::fasttext::Dictionary::getLabel_abi_cxx11_(local_238,local_348,iVar7);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      iVar7 = iVar7 + 1;
    }
    if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
    }
  }
  ::fasttext::Meter::writeGeneralMetrics((Meter *)local_2b8,(ostream *)&std::cout,k);
  exit(0);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter(false);

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}